

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void JS_AddIntrinsicMapSet(JSContext *ctx)

{
  JSValue *pJVar1;
  char *in_RCX;
  ulong uVar2;
  byte *pbVar3;
  long lVar4;
  JSValue obj;
  JSValue JVar5;
  JSValue proto;
  char buf [64];
  char local_78 [72];
  
  lVar4 = 0;
  uVar2 = 0;
  do {
    in_RCX = JS_AtomGetStrRT(ctx->rt,local_78,(int)uVar2 + 0xaa,(JSAtom)in_RCX);
    pJVar1 = ctx->class_proto;
    JVar5 = JS_NewObjectProtoClass(ctx,pJVar1[1],1);
    *(JSValueUnion *)((long)&pJVar1[0x1f].u + lVar4 * 2) = JVar5.u;
    *(int64_t *)((long)&pJVar1[0x1f].tag + lVar4 * 2) = JVar5.tag;
    JVar5.tag = *(int64_t *)((long)&ctx->class_proto[0x1f].tag + lVar4 * 2);
    JVar5.u.ptr = ((JSValueUnion *)((long)&ctx->class_proto[0x1f].u + lVar4 * 2))->ptr;
    JS_SetPropertyFunctionList
              (ctx,JVar5,*(JSCFunctionListEntry **)((long)js_map_proto_funcs_ptr + lVar4),
               (uint)"\f\v\x05\x04\x02\x02"[uVar2]);
    JVar5 = JS_NewCFunction3(ctx,js_map_constructor,in_RCX,0,JS_CFUNC_constructor_magic,(int)uVar2,
                             ctx->function_proto);
    if (uVar2 < 2) {
      JS_SetPropertyFunctionList(ctx,JVar5,js_map_funcs,1);
    }
    proto.tag = *(int64_t *)((long)&ctx->class_proto[0x1f].tag + lVar4 * 2);
    proto.u.ptr = ((JSValueUnion *)((long)&ctx->class_proto[0x1f].u + lVar4 * 2))->ptr;
    JS_NewGlobalCConstructor2(ctx,JVar5,in_RCX,proto);
    uVar2 = uVar2 + 1;
    lVar4 = lVar4 + 8;
  } while (uVar2 != 4);
  pbVar3 = "\x02\x02";
  lVar4 = 0;
  do {
    pJVar1 = ctx->class_proto;
    JVar5 = JS_NewObjectProtoClass(ctx,ctx->iterator_proto,1);
    *(JSValueUnion *)((long)&pJVar1[0x23].u + lVar4 * 2) = JVar5.u;
    *(int64_t *)((long)&pJVar1[0x23].tag + lVar4 * 2) = JVar5.tag;
    obj.tag = *(int64_t *)((long)&ctx->class_proto[0x23].tag + lVar4 * 2);
    obj.u.ptr = ((JSValueUnion *)((long)&ctx->class_proto[0x23].u + lVar4 * 2))->ptr;
    JS_SetPropertyFunctionList
              (ctx,obj,*(JSCFunctionListEntry **)((long)js_map_proto_funcs_ptr + lVar4 + 0x20),
               (uint)*pbVar3);
    lVar4 = lVar4 + 8;
    pbVar3 = pbVar3 + 1;
  } while (lVar4 == 8);
  return;
}

Assistant:

void JS_AddIntrinsicMapSet(JSContext *ctx)
{
    int i;
    JSValue obj1;
    char buf[ATOM_GET_STR_BUF_SIZE];

    for(i = 0; i < 4; i++) {
        const char *name = JS_AtomGetStr(ctx, buf, sizeof(buf),
                                         JS_ATOM_Map + i);
        ctx->class_proto[JS_CLASS_MAP + i] = JS_NewObject(ctx);
        JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_MAP + i],
                                   js_map_proto_funcs_ptr[i],
                                   js_map_proto_funcs_count[i]);
        obj1 = JS_NewCFunctionMagic(ctx, js_map_constructor, name, 0,
                                    JS_CFUNC_constructor_magic, i);
        if (i < 2) {
            JS_SetPropertyFunctionList(ctx, obj1, js_map_funcs,
                                       countof(js_map_funcs));
        }
        JS_NewGlobalCConstructor2(ctx, obj1, name, ctx->class_proto[JS_CLASS_MAP + i]);
    }

    for(i = 0; i < 2; i++) {
        ctx->class_proto[JS_CLASS_MAP_ITERATOR + i] =
            JS_NewObjectProto(ctx, ctx->iterator_proto);
        JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_MAP_ITERATOR + i],
                                   js_map_proto_funcs_ptr[i + 4],
                                   js_map_proto_funcs_count[i + 4]);
    }
}